

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

ZSTDVectorScanMetadata * __thiscall
duckdb::ZSTDScanState::GetVectorMetadata
          (ZSTDVectorScanMetadata *__return_storage_ptr__,ZSTDScanState *this,idx_t vector_idx)

{
  idx_t iVar1;
  ulong uVar2;
  
  iVar1 = this->segment_count;
  __return_storage_ptr__->vector_idx = vector_idx;
  __return_storage_ptr__->block_id = this->page_ids[vector_idx];
  __return_storage_ptr__->block_offset = this->page_offsets[vector_idx];
  uVar2 = iVar1 + vector_idx * -0x800;
  if (0x7ff < uVar2) {
    uVar2 = 0x800;
  }
  __return_storage_ptr__->uncompressed_size = this->uncompressed_sizes[vector_idx];
  __return_storage_ptr__->compressed_size = this->compressed_sizes[vector_idx];
  __return_storage_ptr__->count = uVar2;
  return __return_storage_ptr__;
}

Assistant:

ZSTDVectorScanMetadata GetVectorMetadata(idx_t vector_idx) {
		idx_t previous_value_count = vector_idx * ZSTD_VECTOR_SIZE;
		idx_t value_count = MinValue<idx_t>(segment_count - previous_value_count, ZSTD_VECTOR_SIZE);

		return ZSTDVectorScanMetadata {/* vector_idx = */ vector_idx,
		                               /* block_id = */ page_ids[vector_idx],
		                               /* block_offset = */ page_offsets[vector_idx],
		                               /* uncompressed_size = */ uncompressed_sizes[vector_idx],
		                               /* compressed_size = */ compressed_sizes[vector_idx],
		                               /* count = */ value_count};
	}